

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcpLightCfg.c
# Opt level: O0

void XcpLightCfg_writeToAddress(uint8_t *dest,uint8_t length,uint8_t *data)

{
  uint8_t *local_20;
  uint8_t *data_local;
  uint8_t *puStack_10;
  uint8_t length_local;
  uint8_t *dest_local;
  
  local_20 = data;
  data_local._7_1_ = length;
  puStack_10 = dest;
  if (dest != (uint8_t *)0x0) {
    for (; data_local._7_1_ != '\0'; data_local._7_1_ = data_local._7_1_ + 0xff) {
      *puStack_10 = *local_20;
      local_20 = local_20 + 1;
      puStack_10 = puStack_10 + 1;
    }
  }
  return;
}

Assistant:

void XcpLightCfg_writeToAddress(uint8_t *dest, uint8_t length, uint8_t * data)
{
  if (dest != NULL)
  {
    while (length)
    {
      *dest = (*data);
      data++;
      dest++;
      length--;
    }
  }
}